

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlIO(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  uint uVar44;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing xmlIO : 40 of 50 functions ...\n");
  }
  iVar1 = test_xmlAllocOutputBuffer();
  iVar2 = test_xmlAllocParserInputBuffer();
  iVar3 = test_xmlCheckFilename();
  iVar4 = test_xmlCheckHTTPInput();
  iVar5 = test_xmlCleanupInputCallbacks();
  iVar6 = test_xmlCleanupOutputCallbacks();
  iVar7 = test_xmlFileClose();
  iVar8 = test_xmlFileMatch();
  iVar9 = test_xmlFileOpen();
  iVar10 = test_xmlFileRead();
  iVar11 = test_xmlIOFTPClose();
  iVar12 = test_xmlIOFTPMatch();
  iVar13 = test_xmlIOFTPOpen();
  iVar14 = test_xmlIOFTPRead();
  iVar15 = test_xmlIOHTTPClose();
  iVar16 = test_xmlIOHTTPMatch();
  iVar17 = test_xmlIOHTTPOpen();
  iVar18 = test_xmlIOHTTPRead();
  iVar19 = test_xmlNoNetExternalEntityLoader();
  iVar20 = test_xmlNormalizeWindowsPath();
  iVar21 = test_xmlOutputBufferCreateBuffer();
  iVar22 = test_xmlOutputBufferCreateFd();
  iVar23 = test_xmlOutputBufferCreateFile();
  iVar24 = test_xmlOutputBufferCreateFilename();
  iVar25 = test_xmlOutputBufferFlush();
  iVar26 = test_xmlOutputBufferGetContent();
  iVar27 = test_xmlOutputBufferGetSize();
  iVar28 = test_xmlOutputBufferWrite();
  iVar29 = test_xmlOutputBufferWriteEscape();
  iVar30 = test_xmlOutputBufferWriteString();
  iVar31 = test_xmlParserGetDirectory();
  iVar32 = test_xmlParserInputBufferCreateFd();
  iVar33 = test_xmlParserInputBufferCreateFile();
  iVar34 = test_xmlParserInputBufferCreateFilename();
  iVar35 = test_xmlParserInputBufferCreateMem();
  iVar36 = test_xmlParserInputBufferCreateStatic();
  iVar37 = test_xmlParserInputBufferGrow();
  iVar38 = test_xmlParserInputBufferPush();
  iVar39 = test_xmlParserInputBufferRead();
  iVar40 = test_xmlPopInputCallbacks();
  iVar41 = test_xmlRegisterDefaultInputCallbacks();
  iVar42 = test_xmlRegisterDefaultOutputCallbacks();
  iVar43 = test_xmlRegisterHTTPPostCallbacks();
  uVar44 = iVar43 + iVar42 + iVar41 + iVar40 + iVar39 + iVar38 + iVar37 + iVar36 + iVar35 + iVar34 +
                                                                                            iVar33 +
                                                                                            iVar32 +
                                                                                            iVar31 +
                                                                                            iVar30 +
                                                                                            iVar29 +
                                                                                            iVar28 +
                                                                                            iVar27 +
                                                                                            iVar26 +
                                                                                            iVar25 +
                                                                                            iVar24 +
                                                                                            iVar23 +
                                                                                            iVar22 +
                                                                                            iVar21 +
                                                                                            iVar20 +
                                                                                            iVar19 +
                                                                                            iVar18 +
                                                                                            iVar17 +
                                                                                            iVar16 +
                                                                                            iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar44 != 0) {
    printf("Module xmlIO: %d errors\n",(ulong)uVar44);
  }
  return uVar44;
}

Assistant:

static int
test_xmlIO(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlIO : 40 of 50 functions ...\n");
    test_ret += test_xmlAllocOutputBuffer();
    test_ret += test_xmlAllocParserInputBuffer();
    test_ret += test_xmlCheckFilename();
    test_ret += test_xmlCheckHTTPInput();
    test_ret += test_xmlCleanupInputCallbacks();
    test_ret += test_xmlCleanupOutputCallbacks();
    test_ret += test_xmlFileClose();
    test_ret += test_xmlFileMatch();
    test_ret += test_xmlFileOpen();
    test_ret += test_xmlFileRead();
    test_ret += test_xmlIOFTPClose();
    test_ret += test_xmlIOFTPMatch();
    test_ret += test_xmlIOFTPOpen();
    test_ret += test_xmlIOFTPRead();
    test_ret += test_xmlIOHTTPClose();
    test_ret += test_xmlIOHTTPMatch();
    test_ret += test_xmlIOHTTPOpen();
    test_ret += test_xmlIOHTTPRead();
    test_ret += test_xmlNoNetExternalEntityLoader();
    test_ret += test_xmlNormalizeWindowsPath();
    test_ret += test_xmlOutputBufferCreateBuffer();
    test_ret += test_xmlOutputBufferCreateFd();
    test_ret += test_xmlOutputBufferCreateFile();
    test_ret += test_xmlOutputBufferCreateFilename();
    test_ret += test_xmlOutputBufferFlush();
    test_ret += test_xmlOutputBufferGetContent();
    test_ret += test_xmlOutputBufferGetSize();
    test_ret += test_xmlOutputBufferWrite();
    test_ret += test_xmlOutputBufferWriteEscape();
    test_ret += test_xmlOutputBufferWriteString();
    test_ret += test_xmlParserGetDirectory();
    test_ret += test_xmlParserInputBufferCreateFd();
    test_ret += test_xmlParserInputBufferCreateFile();
    test_ret += test_xmlParserInputBufferCreateFilename();
    test_ret += test_xmlParserInputBufferCreateMem();
    test_ret += test_xmlParserInputBufferCreateStatic();
    test_ret += test_xmlParserInputBufferGrow();
    test_ret += test_xmlParserInputBufferPush();
    test_ret += test_xmlParserInputBufferRead();
    test_ret += test_xmlPopInputCallbacks();
    test_ret += test_xmlRegisterDefaultInputCallbacks();
    test_ret += test_xmlRegisterDefaultOutputCallbacks();
    test_ret += test_xmlRegisterHTTPPostCallbacks();

    if (test_ret != 0)
	printf("Module xmlIO: %d errors\n", test_ret);
    return(test_ret);
}